

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

void __thiscall
helics::InterfaceInfo::createEndpoint
          (InterfaceInfo *this,InterfaceHandle handle,string_view endpointName,string_view type,
          uint16_t flags)

{
  pointer this_00;
  allocator<char> local_7d;
  InterfaceHandle handle_local;
  handle ceHandle;
  string_view type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string_view endpointName_local;
  GlobalHandle local_20;
  
  type_local._M_str = type._M_str;
  type_local._M_len = type._M_len;
  endpointName_local._M_str = endpointName._M_str;
  endpointName_local._M_len = endpointName._M_len;
  handle_local = handle;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&ceHandle,&this->endpoints);
  this_00 = ceHandle.data;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&endpointName_local,&local_7d);
  local_20.fed_id.gid = (this->global_id)._M_i.gid;
  local_20.handle.hid = handle_local.hid;
  gmlc::containers::
  DualMappedPointerVector<helics::EndpointInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((DualMappedPointerVector<helics::EndpointInfo,std::__cxx11::string,helics::InterfaceHandle>
              *)this_00,&local_50,&handle_local,&local_20,&endpointName_local,&type_local);
  std::__cxx11::string::~string((string *)&local_50);
  if ((flags & 4) != 0) {
    EndpointInfo::setProperty
              (((ceHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,0x18d,1);
  }
  if ((flags >> 8 & 1) != 0) {
    EndpointInfo::setProperty
              (((ceHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,0x192,1);
  }
  if ((flags >> 10 & 1) != 0) {
    (((ceHandle.data)->dataStorage).
     super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>._M_t.
     super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>.
     super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->targetedEndpoint = true;
  }
  if ((flags & 8) != 0) {
    EndpointInfo::setProperty
              (((ceHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,0x197,1);
  }
  if ((flags >> 0xd & 1) != 0) {
    EndpointInfo::setProperty
              (((ceHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,0x1a7,1);
  }
  if ((flags >> 0xe & 1) != 0) {
    EndpointInfo::setProperty
              (((ceHandle.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
               .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,0x1a6,1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&ceHandle.m_handle_lock);
  return;
}

Assistant:

void InterfaceInfo::createEndpoint(InterfaceHandle handle,
                                   std::string_view endpointName,
                                   std::string_view type,
                                   std::uint16_t flags)
{
    auto ceHandle = endpoints.lock();
    ceHandle->insert(
        std::string(endpointName), handle, GlobalHandle{global_id, handle}, endpointName, type);
    if (checkActionFlag(flags, required_flag)) {
        ceHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        ceHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, targeted_flag)) {
        ceHandle->back()->targetedEndpoint = true;
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        ceHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
    if (checkActionFlag(flags, source_only_flag)) {
        ceHandle->back()->setProperty(defs::Options::SEND_ONLY, 1);
    }
    if (checkActionFlag(flags, receive_only_flag)) {
        ceHandle->back()->setProperty(defs::Options::RECEIVE_ONLY, 1);
    }
}